

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O2

bool __thiscall iDynTree::JointSensor::isConsistent(JointSensor *this,Model *model)

{
  int iVar1;
  JointIndex JVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  string local_60;
  string local_40 [32];
  
  (*(this->super_Sensor)._vptr_Sensor[9])(&local_60,this);
  JVar2 = Model::getJointIndex(model,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (JVar2 == JOINT_INVALID_INDEX) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Sensor ");
    (*(this->super_Sensor)._vptr_Sensor[2])(&local_60,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    poVar3 = std::operator<<(poVar3," is not consistent because the joint ");
    (*(this->super_Sensor)._vptr_Sensor[9])(local_40,this);
    poVar3 = std::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3," does not exist in the specified model");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    iVar1 = (*(this->super_Sensor)._vptr_Sensor[10])(this);
    if (JVar2 == CONCAT44(extraout_var,iVar1)) {
      return true;
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"[ERROR] Sensor ");
    (*(this->super_Sensor)._vptr_Sensor[2])(&local_60,this);
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    poVar3 = std::operator<<(poVar3," is not consistent because it is attached to joint ");
    (*(this->super_Sensor)._vptr_Sensor[9])(local_40,this);
    poVar3 = std::operator<<(poVar3,local_40);
    poVar3 = std::operator<<(poVar3," that has index ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3," in the model, while the sensor ");
    poVar3 = std::operator<<(poVar3," has it saved with link index ");
    (*(this->super_Sensor)._vptr_Sensor[10])(this);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return false;
}

Assistant:

bool JointSensor::isConsistent(const Model& model) const
{
    LinkIndex jntIdxInModel = model.getJointIndex(this->getParentJoint());

    if (jntIdxInModel == JOINT_INVALID_INDEX)
    {
        std::cerr << "[ERROR] Sensor " << this->getName() << " is not consistent because the joint "
                  << this->getParentJoint() << " does not exist in the specified model" << std::endl;
        return false;
    }

    if (jntIdxInModel != this->getParentJointIndex())
    {
        std::cerr << "[ERROR] Sensor " << this->getName() << " is not consistent because it is attached to joint "
                  << this->getParentJoint() << " that has index " << jntIdxInModel << " in the model, while the sensor "
                  << " has it saved with link index " << this->getParentJointIndex() << std::endl;
        return false;
    }

    return true;
}